

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

EncodingResult<kj::Array<char32_t>_> *
kj::encodeUtf32(EncodingResult<kj::Array<char32_t>_> *__return_storage_ptr__,
               ArrayPtr<const_char> text,bool nulTerminate)

{
  bool in_R8B;
  ArrayPtr<const_char> text_00;
  bool nulTerminate_local;
  ArrayPtr<const_char> text_local;
  
  text_00.ptr = text.size_;
  text_00.size_._0_1_ = nulTerminate;
  text_00.size_._1_7_ = 0;
  anon_unknown_0::encodeUtf<char32_t>
            (__return_storage_ptr__,(anon_unknown_0 *)text.ptr,text_00,in_R8B);
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<char32_t>> encodeUtf32(ArrayPtr<const char> text, bool nulTerminate) {
  return encodeUtf<char32_t>(text, nulTerminate);
}